

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_eq.c
# Opt level: O0

uint32_t FAPOFXCreateEQ(FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                       FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                       FAudioReallocFunc customRealloc,uint8_t legacy)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  FAudioMallocFunc in_RCX;
  uint in_EDX;
  long in_RSI;
  FAPORegistrationProperties *pRegistrationProperties;
  undefined8 *in_RDI;
  FAudioFreeFunc in_R8;
  FAudioReallocFunc in_R9;
  char in_stack_00000008;
  SDL_AssertState sdl_assert_state;
  uint8_t *params;
  FAPOFXEQ *result;
  FAPOFXEQParameters fxdefault;
  undefined1 local_60 [48];
  FAudioReallocFunc local_30;
  FAudioFreeFunc local_28;
  FAudioMallocFunc local_20;
  uint local_14;
  long local_10;
  undefined8 *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_60,&DAT_0014979c,0x30);
  fapo = (FAPOBase *)(*local_20)(0xe0);
  pParameterBlocks = (uint8_t *)(*local_20)(0x90);
  if (local_10 == 0) {
    SDL_memset(pParameterBlocks,0,0x90);
    SDL_memcpy(pParameterBlocks,local_60,0x30);
    SDL_memcpy(pParameterBlocks + 0x30,local_60,0x30);
    SDL_memcpy(pParameterBlocks + 0x60,local_60,0x30);
  }
  else {
    do {
      if (local_14 == 0x30) goto LAB_00123b21;
      iVar2 = SDL_ReportAssertion(&FAPOFXCreateEQ::sdl_assert_data,"FAPOFXCreateEQ",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAPOFX_eq.c"
                                  ,0xd9);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00123b21:
    SDL_memcpy(pParameterBlocks,local_10,local_14);
    SDL_memcpy(pParameterBlocks + local_14,local_10,local_14);
    SDL_memcpy(pParameterBlocks + (local_14 << 1),local_10,local_14);
  }
  SDL_memcpy(&FXEQProperties_LEGACY,&FAPOFX_CLSID_FXEQ_LEGACY,0x10);
  SDL_memcpy(&FXEQProperties,&FAPOFX_CLSID_FXEQ,0x10);
  pRegistrationProperties = &FXEQProperties;
  if (in_stack_00000008 != '\0') {
    pRegistrationProperties = &FXEQProperties_LEGACY;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,0x30,'\0',local_20,local_28,local_30);
  (fapo->base).Initialize = FAPOFXEQ_Initialize;
  (fapo->base).Process = FAPOFXEQ_Process;
  fapo->Destructor = FAPOFXEQ_Free;
  *local_8 = fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateEQ(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXEQParameters fxdefault =
	{
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_0,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_1,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_2,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_3,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH
	};

	/* Allocate... */
	FAPOFXEQ *result = (FAPOFXEQ*) customMalloc(
		sizeof(FAPOFXEQ)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXEQParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXEQParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXEQParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXEQParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXEQParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXEQProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXEQ_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXEQProperties.clsid,
		&FAPOFX_CLSID_FXEQ,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXEQProperties_LEGACY : &FXEQProperties,
		params,
		sizeof(FAPOFXEQParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXEQ_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXEQ_Process;
	result->base.Destructor = FAPOFXEQ_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}